

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void test<unsigned_long>(bool shouldBeValid,string *value)

{
  AssertionResult *pAVar1;
  type_conflict5 __val;
  unsigned_long __val_00;
  AssertionResult *this;
  char *pcVar2;
  bool shouldBeValid_local;
  AssertHelper local_68;
  AssertionResult gtest_ar_1;
  bool valid;
  AssertionResult gtest_ar;
  
  pcVar2 = (value->_M_dataplus)._M_p;
  shouldBeValid_local = shouldBeValid;
  __val = jsteemann::atoi<unsigned_long>(pcVar2,pcVar2 + value->_M_string_length,&valid);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"shouldBeValid","valid",&shouldBeValid_local,&valid);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_1);
    pAVar1 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    this = &gtest_ar_1;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    if (shouldBeValid_local != true) {
      return;
    }
    std::__cxx11::to_string((string *)&gtest_ar,__val);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"value","std::to_string(result)",value,(string *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                 ,0xe,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      pcVar2 = (value->_M_dataplus)._M_p;
      __val_00 = jsteemann::atoi_unchecked<unsigned_long>(pcVar2,pcVar2 + value->_M_string_length);
      std::__cxx11::to_string((string *)&gtest_ar,__val_00);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar_1,"value","std::to_string(result2)",value,(string *)&gtest_ar
                );
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (gtest_ar_1.success_ != false) {
        pAVar1 = &gtest_ar_1;
        goto LAB_00127bde;
      }
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                 ,0x10,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar);
    }
    pAVar1 = &gtest_ar_1;
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    this = &gtest_ar;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this);
LAB_00127bde:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  return;
}

Assistant:

static void test(bool shouldBeValid, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_EQ(shouldBeValid, valid);
  if (shouldBeValid) {
    ASSERT_EQ(value, std::to_string(result));
    T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
    ASSERT_EQ(value, std::to_string(result2));
  }
}